

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::WildcardUdpPortListSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,WildcardUdpPortListSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (WildcardUdpPortListSyntax *)0x0:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[1].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (WildcardUdpPortListSyntax *)0x1:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[2].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (WildcardUdpPortListSyntax *)0x2:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[3].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (WildcardUdpPortListSyntax *)0x3:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[4].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (WildcardUdpPortListSyntax *)0x4:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[5].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  default:
    p_Var1 = (__index_type *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax WildcardUdpPortListSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &openParen;
        case 1: return &dot;
        case 2: return &star;
        case 3: return &closeParen;
        case 4: return &semi;
        default: return nullptr;
    }
}